

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

shared_ptr<ot::commissioner::coap::Message> __thiscall
ot::commissioner::coap::Message::Deserialize(Message *this,Error *aError,ByteArray *aBuf)

{
  char cVar1;
  ErrorCode EVar2;
  pointer puVar3;
  OptionType aType;
  Message *pMVar4;
  bool bVar5;
  ushort uVar6;
  Error *pEVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  shared_ptr<ot::commissioner::coap::Message> sVar11;
  OptionType number;
  Message *local_118;
  uint local_10c;
  undefined1 local_108 [8];
  _Alloc_hider _Stack_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  parse_func local_e0 [1];
  size_t offset;
  OptionValue value;
  Error error;
  string local_88;
  ByteArray *local_68;
  Error *local_60;
  undefined1 local_58 [40];
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  offset = 0;
  std::make_shared<ot::commissioner::coap::Message>();
  local_118 = this;
  local_60 = aError;
  Deserialize((Error *)local_108,*(Header **)&this->mHeader,aBuf,&offset);
  pEVar7 = Error::operator=(&error,(Error *)local_108);
  EVar2 = pEVar7->mCode;
  std::__cxx11::string::~string((string *)&_Stack_100);
  if (EVar2 == kNone) {
    if (**(byte **)&local_118->mHeader < 0x90 && (**(byte **)&local_118->mHeader & 3) == 1) {
      local_10c = 0;
      local_68 = aBuf;
      do {
        puVar3 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
        if (uVar9 <= offset) break;
        if (puVar3[offset] == 0xff) {
          offset = offset + 1;
          if (uVar9 <= offset) {
            local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
            _Stack_100._M_p = "payload marker followed by empty payload";
            local_f8 = 0x28;
            local_f0._M_allocated_capacity = 0;
            local_e0[0] = (parse_func)0x0;
            pcVar8 = "payload marker followed by empty payload";
            local_f0._8_8_ = (format_string_checker<char> *)local_108;
            value.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_108;
            while (pcVar8 != "") {
              cVar1 = *pcVar8;
              pcVar10 = pcVar8;
              while (cVar1 != '{') {
                pcVar10 = pcVar10 + 1;
                if (pcVar10 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()((writer *)&value,pcVar8,"");
                  goto LAB_001a01d0;
                }
                cVar1 = *pcVar10;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&value,pcVar8,pcVar10);
              pcVar8 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar10,"",(format_string_checker<char> *)local_108);
            }
LAB_001a01d0:
            args_01.field_1.args_ = in_R9.args_;
            args_01.desc_ = (unsigned_long_long)local_108;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_88,(v10 *)"payload marker followed by empty payload",
                       (string_view)ZEXT816(0x28),args_01);
            local_58._0_4_ = kBadFormat;
            std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_88);
            goto LAB_001a0095;
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                     (*(long *)&local_118->mHeader + 0x40),puVar3 + offset);
          break;
        }
        value.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        value.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        value.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        in_R9.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&offset;
        Deserialize((Error *)local_108,&number,&value,(uint16_t)local_10c,aBuf,
                    (size_t *)in_R9.values_);
        pEVar7 = Error::operator=(&error,(Error *)local_108);
        EVar2 = pEVar7->mCode;
        std::__cxx11::string::~string((string *)&_Stack_100);
        aType = number;
        if (EVar2 == kNone) {
          bVar5 = IsValidOption(number,&value);
          if (bVar5) {
            AppendOption((Error *)local_108,*(Message **)&local_118->mHeader,aType,&value);
            Error::operator=(&error,(Error *)local_108);
            std::__cxx11::string::~string((string *)&_Stack_100);
          }
          else {
            local_108._0_4_ = custom_type;
            _Stack_100._M_p = "bad CoAP option (number={}";
            local_f8 = 0x1a;
            local_f0._M_allocated_capacity = 0x100000000;
            local_e0[0] = ::fmt::v10::detail::
                          parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar8 = "bad CoAP option (number={}";
            local_f0._8_8_ = (format_string_checker<char> *)local_108;
            while (pcVar10 = pcVar8, pcVar10 != "") {
              pcVar8 = pcVar10 + 1;
              if (*pcVar10 == '}') {
                if ((pcVar8 == "") || (*pcVar8 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar8 = pcVar10 + 2;
              }
              else if (*pcVar10 == '{') {
                pcVar8 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                                   (pcVar10,"",(format_string_checker<char> *)local_108);
              }
            }
            local_108 = (undefined1  [8])&number;
            _Stack_100._M_p =
                 (pointer)::fmt::v10::detail::
                          value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
                          format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
            ;
            fmt.size_ = 0xf;
            fmt.data_ = (char *)0x1a;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)local_108;
            ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"bad CoAP option (number={}",fmt,args);
            local_58._0_4_ = kBadFormat;
            std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_88);
            Error::operator=(&error,(Error *)local_58);
            std::__cxx11::string::~string((string *)(local_58 + 8));
            std::__cxx11::string::~string((string *)&local_88);
            aBuf = local_68;
          }
          if (error.mCode != kNone) {
            uVar6 = (ushort)(number - kIfMatch) >> 1 | (ushort)((number - kIfMatch & 1) != 0) << 0xf
            ;
            if ((uVar6 < 0x14) && ((0xa01afU >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_0019ff8d;
            local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
            _Stack_100._M_p = (pointer)&local_f0;
            local_f8 = 0;
            local_f0._M_allocated_capacity = local_f0._M_allocated_capacity & 0xffffffffffffff00;
            Error::operator=(&error,(Error *)local_108);
            std::__cxx11::string::~string((string *)&_Stack_100);
          }
          bVar5 = true;
          local_10c = (uint)number;
        }
        else {
LAB_0019ff8d:
          bVar5 = false;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
      } while (bVar5);
    }
    else {
      local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
      _Stack_100._M_p = "invalid CoAP message header";
      local_f8 = 0x1b;
      local_f0._M_allocated_capacity = 0;
      local_e0[0] = (parse_func)0x0;
      pcVar8 = "invalid CoAP message header";
      local_f0._8_8_ = (format_string_checker<char> *)local_108;
      while (pcVar10 = pcVar8, pcVar10 != "") {
        pcVar8 = pcVar10 + 1;
        if (*pcVar10 == '}') {
          if ((pcVar8 == "") || (*pcVar8 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar8 = pcVar10 + 2;
        }
        else if (*pcVar10 == '{') {
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar10,"",(format_string_checker<char> *)local_108);
        }
      }
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_108;
      ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)0x1fcbee,(string_view)ZEXT816(0x1b),args_00);
      local_58._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_88);
LAB_001a0095:
      Error::operator=(&error,(Error *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  pMVar4 = local_118;
  if (error.mCode != kNone) {
    local_108 = (undefined1  [8])0x0;
    _Stack_100._M_p = (pointer)0x0;
    std::__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> *)
               local_118,
               (__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> *)
               local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_100);
  }
  Error::operator=(local_60,&error);
  std::__cxx11::string::~string((string *)&error.mMessage);
  sVar11.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar11.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pMVar4;
  return (shared_ptr<ot::commissioner::coap::Message>)
         sVar11.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Message> Message::Deserialize(Error &aError, const ByteArray &aBuf)
{
    Error    error;
    size_t   offset = 0;
    uint16_t lastOptionNumber;
    auto     message = std::make_shared<Message>();

    SuccessOrExit(error = Deserialize(message->mHeader, aBuf, offset));
    VerifyOrExit(message->mHeader.IsValid(), error = ERROR_BAD_FORMAT("invalid CoAP message header"));

    lastOptionNumber = 0;
    while (offset < aBuf.size() && aBuf[offset] != kPayloadMarker)
    {
        OptionType  number;
        OptionValue value;

        SuccessOrExit(error = Deserialize(number, value, lastOptionNumber, aBuf, offset));

        if (IsValidOption(number, value))
        {
            // AppendOption will do further validation before adding the option.
            error = message->AppendOption(number, value);
        }
        else
        {
            error = ERROR_BAD_FORMAT("bad CoAP option (number={}", number);
        }

        if (error != ErrorCode::kNone)
        {
            if (IsCriticalOption(number))
            {
                // Stop if any unrecognized option is critical.
                ExitNow();
            }
            else
            {
                // Ignore non-critical option error.
                error = ERROR_NONE;
            }
        }

        lastOptionNumber = utils::to_underlying(number);
    }

    if (offset < aBuf.size())
    {
        if (aBuf[offset++] == kPayloadMarker)
        {
            VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("payload marker followed by empty payload"));
            message->mPayload.assign(aBuf.begin() + offset, aBuf.end());
        }
        else
        {
            // Ignore extra data.
            message->mPayload.clear();
        }
    }

exit:
    if (error != ErrorCode::kNone)
    {
        message = nullptr;
    }
    aError = error;
    return message;
}